

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_transform_kernel_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  int k_2;
  float *k00_2;
  int p_2;
  float *g00_2;
  Mat k0_2;
  int k_1;
  float *k30_1;
  float *k20_1;
  float *k10_1;
  float *k00_1;
  int p_1;
  float *g00_1;
  Mat k3_1;
  Mat k2_1;
  Mat k1_1;
  Mat k0_1;
  int k;
  float *k70;
  float *k60;
  float *k50;
  float *k40;
  float *k30;
  float *k20;
  float *k10;
  float *k00;
  int p;
  float *g00;
  Mat k7;
  Mat k6;
  Mat k5;
  Mat k4;
  Mat k3;
  Mat k2;
  Mat k1;
  Mat k0;
  int q;
  Mat kernel;
  int maxk;
  Mat *m_15;
  Mat *m_14;
  Mat *m_13;
  Mat *m_12;
  Mat *m_11;
  Mat *m_10;
  Mat *m_9;
  Mat *m_8;
  Mat *m_7;
  Mat *m_6;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_ffffffffffffea90;
  size_t in_stack_ffffffffffffea98;
  undefined8 in_stack_ffffffffffffeaa0;
  int _c;
  undefined8 in_stack_ffffffffffffeaa8;
  undefined4 in_stack_ffffffffffffeab0;
  undefined4 in_stack_ffffffffffffeab4;
  Allocator *in_stack_ffffffffffffeb70;
  undefined8 in_stack_ffffffffffffeb78;
  undefined8 in_stack_ffffffffffffeb80;
  Mat *in_stack_ffffffffffffeb88;
  int local_12dc;
  int local_12cc;
  undefined8 local_12c8;
  undefined8 local_12c0;
  undefined8 local_12b8;
  undefined4 local_12b0;
  long local_12a8;
  undefined4 local_12a0;
  undefined4 local_129c;
  undefined4 local_1298;
  undefined4 local_1294;
  undefined4 local_1290;
  undefined8 local_1288;
  undefined4 *local_1280;
  undefined8 local_1278;
  undefined8 local_1270;
  undefined8 local_1268;
  undefined4 local_1260;
  undefined4 local_1250;
  undefined4 local_124c;
  undefined4 local_1248;
  undefined4 local_1244;
  undefined4 local_1240;
  undefined8 local_1238;
  int local_122c;
  void *local_1228;
  void *local_1220;
  void *local_1218;
  void *local_1210;
  int local_1204;
  undefined8 local_1200;
  undefined8 local_11f8;
  undefined8 local_11f0;
  undefined4 local_11e8;
  long local_11e0;
  undefined4 local_11d8;
  undefined4 local_11d4;
  undefined4 local_11d0;
  undefined4 local_11cc;
  undefined4 local_11c8;
  undefined8 local_11c0;
  undefined4 *local_11b8;
  undefined8 local_11b0;
  undefined8 local_11a8;
  undefined8 local_11a0;
  undefined4 local_1198;
  undefined4 local_1188;
  undefined4 local_1184;
  undefined4 local_1180;
  undefined4 local_117c;
  undefined4 local_1178;
  undefined8 local_1170;
  undefined8 local_1168;
  undefined8 local_1160;
  undefined8 local_1158;
  undefined4 local_1150;
  undefined4 local_1140;
  undefined4 local_113c;
  undefined4 local_1138;
  undefined4 local_1134;
  undefined4 local_1130;
  undefined8 local_1128;
  undefined8 local_1120;
  undefined8 local_1118;
  undefined8 local_1110;
  undefined4 local_1108;
  undefined4 local_10f8;
  undefined4 local_10f4;
  undefined4 local_10f0;
  undefined4 local_10ec;
  undefined4 local_10e8;
  undefined8 local_10e0;
  undefined8 local_10d8;
  undefined8 local_10d0;
  undefined8 local_10c8;
  undefined4 local_10c0;
  undefined4 local_10b0;
  undefined4 local_10ac;
  undefined4 local_10a8;
  undefined4 local_10a4;
  undefined4 local_10a0;
  undefined8 local_1098;
  int local_108c;
  void *local_1088;
  void *local_1080;
  void *local_1078;
  void *local_1070;
  void *local_1068;
  void *local_1060;
  void *local_1058;
  void *local_1050;
  int local_1044;
  undefined8 local_1040;
  undefined8 local_1038;
  undefined8 local_1030;
  undefined4 local_1028;
  long local_1020;
  undefined4 local_1018;
  undefined4 local_1014;
  undefined4 local_1010;
  undefined4 local_100c;
  undefined4 local_1008;
  undefined8 local_1000;
  undefined4 *local_ff8;
  undefined8 local_ff0;
  undefined8 local_fe8;
  undefined8 local_fe0;
  undefined4 local_fd8;
  undefined4 local_fc8;
  undefined4 local_fc4;
  undefined4 local_fc0;
  undefined4 local_fbc;
  undefined4 local_fb8;
  undefined8 local_fb0;
  undefined8 local_fa8;
  undefined8 local_fa0;
  undefined8 local_f98;
  undefined4 local_f90;
  undefined4 local_f80;
  undefined4 local_f7c;
  undefined4 local_f78;
  undefined4 local_f74;
  undefined4 local_f70;
  undefined8 local_f68;
  undefined8 local_f60;
  undefined8 local_f58;
  undefined8 local_f50;
  undefined4 local_f48;
  undefined4 local_f38;
  undefined4 local_f34;
  undefined4 local_f30;
  undefined4 local_f2c;
  undefined4 local_f28;
  undefined8 local_f20;
  undefined8 local_f18;
  undefined8 local_f10;
  undefined8 local_f08;
  undefined4 local_f00;
  undefined4 local_ef0;
  undefined4 local_eec;
  undefined4 local_ee8;
  undefined4 local_ee4;
  undefined4 local_ee0;
  undefined8 local_ed8;
  undefined8 local_ed0;
  undefined8 local_ec8;
  undefined8 local_ec0;
  undefined4 local_eb8;
  undefined4 local_ea8;
  undefined4 local_ea4;
  undefined4 local_ea0;
  undefined4 local_e9c;
  undefined4 local_e98;
  undefined8 local_e90;
  undefined8 local_e88;
  undefined8 local_e80;
  undefined8 local_e78;
  undefined4 local_e70;
  undefined4 local_e60;
  undefined4 local_e5c;
  undefined4 local_e58;
  undefined4 local_e54;
  undefined4 local_e50;
  undefined8 local_e48;
  undefined8 local_e40;
  undefined8 local_e38;
  undefined8 local_e30;
  undefined4 local_e28;
  undefined4 local_e18;
  undefined4 local_e14;
  undefined4 local_e10;
  undefined4 local_e0c;
  undefined4 local_e08;
  undefined8 local_e00;
  undefined8 local_df8;
  undefined8 local_df0;
  undefined8 local_de8;
  undefined4 local_de0;
  undefined4 local_dd0;
  undefined4 local_dcc;
  undefined4 local_dc8;
  undefined4 local_dc4;
  undefined4 local_dc0;
  undefined8 local_db8;
  int local_db0;
  void *local_da0;
  int *local_d98;
  long local_d90;
  long *local_d80;
  int local_d74;
  int local_d70;
  long local_d60;
  int local_d54;
  int local_d48;
  int local_d44;
  long *local_d40;
  undefined8 *local_d30;
  undefined8 *local_d20;
  undefined8 *local_d10;
  undefined8 *local_d00;
  undefined8 *local_cf0;
  undefined8 *local_ce0;
  undefined8 *local_cd0;
  undefined8 *local_cc0;
  undefined8 *local_cb0;
  undefined8 *local_ca0;
  undefined8 *local_c90;
  undefined8 *local_c80;
  undefined8 *local_c70;
  undefined8 *local_c60;
  undefined8 *local_c50;
  undefined8 *local_c40;
  void **local_c30;
  int local_c10;
  undefined4 local_c0c;
  void **local_c08;
  undefined8 *local_be8;
  undefined8 *local_bc8;
  undefined8 *local_ba8;
  undefined8 *local_b88;
  undefined8 *local_b68;
  undefined8 *local_b48;
  undefined8 *local_b28;
  undefined8 *local_b08;
  undefined8 *local_ae8;
  undefined8 *local_ac8;
  undefined8 *local_aa8;
  undefined8 *local_a88;
  undefined8 *local_a68;
  undefined8 *local_a48;
  undefined8 *local_a28;
  undefined8 *local_a08;
  undefined1 local_9fd;
  int local_9fc;
  undefined8 *local_9f0;
  undefined1 local_9cd;
  int local_9cc;
  void **local_9c8;
  undefined8 *local_9c0;
  undefined1 local_99d;
  int local_99c;
  undefined8 *local_990;
  undefined1 local_96d;
  int local_96c;
  void **local_968;
  undefined8 *local_960;
  undefined1 local_93d;
  int local_93c;
  void **local_938;
  undefined8 *local_930;
  undefined1 local_90d;
  int local_90c;
  void **local_908;
  undefined8 *local_900;
  undefined1 local_8dd;
  int local_8dc;
  void **local_8d8;
  undefined8 *local_8d0;
  undefined1 local_8ad;
  int local_8ac;
  undefined8 *local_8a0;
  undefined1 local_87d;
  int local_87c;
  void **local_878;
  undefined8 *local_870;
  undefined1 local_84d;
  int local_84c;
  void **local_848;
  undefined8 *local_840;
  undefined1 local_81d;
  int local_81c;
  void **local_818;
  undefined8 *local_810;
  undefined1 local_7ed;
  int local_7ec;
  void **local_7e8;
  undefined8 *local_7e0;
  undefined1 local_7bd;
  int local_7bc;
  void **local_7b8;
  undefined8 *local_7b0;
  undefined1 local_78d;
  int local_78c;
  void **local_788;
  undefined8 *local_780;
  undefined1 local_75d;
  int local_75c;
  void **local_758;
  undefined8 *local_750;
  undefined1 local_72d;
  int local_72c;
  void **local_728;
  undefined8 *local_720;
  undefined8 *local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  int local_6e4;
  undefined8 *local_6e0;
  int local_6d4;
  undefined8 *local_6d0;
  int local_6c4;
  undefined8 *local_6c0;
  int local_6b4;
  undefined8 *local_6b0;
  int local_6a4;
  undefined8 *local_6a0;
  int local_694;
  undefined8 *local_690;
  int local_684;
  undefined8 *local_680;
  int local_674;
  undefined8 *local_670;
  int local_664;
  undefined8 *local_660;
  int local_654;
  undefined8 *local_650;
  int local_644;
  undefined8 *local_640;
  int local_634;
  undefined8 *local_630;
  int local_624;
  undefined8 *local_620;
  void *local_470;
  undefined8 *local_458;
  void *local_438;
  undefined8 *local_420;
  void *local_400;
  undefined8 *local_3e8;
  void *local_3c8;
  undefined8 *local_3b0;
  void *local_390;
  undefined8 *local_378;
  void *local_358;
  undefined8 *local_340;
  void *local_320;
  undefined8 *local_308;
  void *local_2e8;
  undefined8 *local_2d0;
  long local_2c8;
  undefined4 local_2bc;
  long local_2b8;
  undefined4 *local_2b0;
  undefined4 local_2a4;
  int local_2a0;
  int local_29c;
  undefined8 *local_298;
  void *local_278;
  undefined8 *local_260;
  void *local_240;
  undefined8 *local_228;
  void *local_208;
  undefined8 *local_1f0;
  void *local_1d0;
  undefined8 *local_1b8;
  long local_1b0;
  undefined4 local_1a4;
  long local_1a0;
  undefined4 *local_198;
  undefined4 local_18c;
  int local_188;
  int local_184;
  undefined8 *local_180;
  void *local_160;
  undefined8 *local_148;
  long local_140;
  undefined4 local_134;
  long local_130;
  undefined4 *local_128;
  undefined4 local_11c;
  int local_118;
  int local_114;
  undefined8 *local_110;
  undefined4 local_104;
  long local_100;
  undefined4 local_f4;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  undefined4 local_c4;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  undefined4 local_a4;
  long local_a0;
  undefined4 local_94;
  long local_90;
  undefined4 local_84;
  long local_80;
  undefined4 local_74;
  long local_70;
  undefined4 local_64;
  long local_60;
  undefined4 local_54;
  long local_50;
  undefined4 local_44;
  long local_40;
  undefined4 local_34;
  long local_30;
  undefined4 local_24;
  long local_20;
  undefined4 local_14;
  long local_10;
  
  _c = (int)((ulong)in_stack_ffffffffffffeaa0 >> 0x20);
  local_d54 = in_R8D * in_R9D;
  local_d48 = in_ECX;
  local_d44 = in_EDX;
  local_d40 = in_RSI;
  Mat::reshape(in_stack_ffffffffffffeb88,(int)((ulong)in_stack_ffffffffffffeb80 >> 0x20),
               (int)in_stack_ffffffffffffeb80,(int)((ulong)in_stack_ffffffffffffeb78 >> 0x20),
               in_stack_ffffffffffffeb70);
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffeab4,in_stack_ffffffffffffeab0),
              (int)((ulong)in_stack_ffffffffffffeaa8 >> 0x20),(int)in_stack_ffffffffffffeaa8,_c,
              in_stack_ffffffffffffea98,in_stack_ffffffffffffea90);
  for (local_db0 = 0; local_db0 + 7 < local_d48; local_db0 = local_db0 + 8) {
    local_720 = &local_df8;
    local_728 = &local_da0;
    local_470 = (void *)((long)local_da0 + local_d60 * local_db0 * local_d90);
    local_458 = &local_df8;
    local_10 = (long)local_d74 * (long)local_d70 * local_d90;
    local_75c = local_db0 + 1;
    local_750 = &local_e40;
    local_758 = &local_da0;
    local_438 = (void *)((long)local_da0 + local_d60 * local_75c * local_d90);
    local_420 = &local_e40;
    local_20 = (long)local_d74 * (long)local_d70 * local_d90;
    local_78c = local_db0 + 2;
    local_780 = &local_e88;
    local_788 = &local_da0;
    local_400 = (void *)((long)local_da0 + local_d60 * local_78c * local_d90);
    local_3e8 = &local_e88;
    local_30 = (long)local_d74 * (long)local_d70 * local_d90;
    local_7bc = local_db0 + 3;
    local_7b0 = &local_ed0;
    local_7b8 = &local_da0;
    local_3c8 = (void *)((long)local_da0 + local_d60 * local_7bc * local_d90);
    local_3b0 = &local_ed0;
    local_40 = (long)local_d74 * (long)local_d70 * local_d90;
    local_7ec = local_db0 + 4;
    local_7e0 = &local_f18;
    local_7e8 = &local_da0;
    local_390 = (void *)((long)local_da0 + local_d60 * local_7ec * local_d90);
    local_378 = &local_f18;
    local_50 = (long)local_d74 * (long)local_d70 * local_d90;
    local_81c = local_db0 + 5;
    local_810 = &local_f60;
    local_818 = &local_da0;
    local_358 = (void *)((long)local_da0 + local_d60 * local_81c * local_d90);
    local_340 = &local_f60;
    local_60 = (long)local_d74 * (long)local_d70 * local_d90;
    local_84c = local_db0 + 6;
    local_840 = &local_fa8;
    local_848 = &local_da0;
    local_320 = (void *)((long)local_da0 + local_d60 * local_84c * local_d90);
    local_308 = &local_fa8;
    local_70 = (long)local_d74 * (long)local_d70 * local_d90;
    local_87c = local_db0 + 7;
    local_870 = &local_ff0;
    local_878 = &local_da0;
    local_2e8 = (void *)((long)local_da0 + local_d60 * local_87c * local_d90);
    local_2d0 = &local_ff0;
    local_80 = (long)local_d74 * (long)local_d70 * local_d90;
    local_8ac = local_db0 / 8;
    local_8a0 = &local_1040;
    local_29c = *(int *)((long)local_d40 + 0x2c);
    local_2a0 = (int)local_d40[6];
    local_2a4 = *(undefined4 *)((long)local_d40 + 0x34);
    local_2b0 = (undefined4 *)(*local_d40 + local_d40[8] * (long)local_8ac * local_d40[2]);
    local_2b8 = local_d40[2];
    local_2bc = (undefined4)local_d40[3];
    local_2c8 = local_d40[4];
    local_298 = &local_1040;
    local_90 = (long)local_29c * (long)local_2a0 * local_2b8;
    local_6f0 = &local_1040;
    local_d30 = &local_1040;
    local_ff8 = local_2b0;
    for (local_1044 = 0; local_1044 < local_d44; local_1044 = local_1044 + 1) {
      local_620 = &local_df8;
      local_624 = local_1044;
      local_1050 = (void *)((long)local_470 + (long)local_d74 * (long)local_1044 * local_d90);
      local_630 = &local_e40;
      local_634 = local_1044;
      local_1058 = (void *)((long)local_438 + (long)local_d74 * (long)local_1044 * local_d90);
      local_640 = &local_e88;
      local_644 = local_1044;
      local_1060 = (void *)((long)local_400 + (long)local_d74 * (long)local_1044 * local_d90);
      local_650 = &local_ed0;
      local_654 = local_1044;
      local_1068 = (void *)((long)local_3c8 + (long)local_d74 * (long)local_1044 * local_d90);
      local_660 = &local_f18;
      local_664 = local_1044;
      local_1070 = (void *)((long)local_390 + (long)local_d74 * (long)local_1044 * local_d90);
      local_670 = &local_f60;
      local_674 = local_1044;
      local_1078 = (void *)((long)local_358 + (long)local_d74 * (long)local_1044 * local_d90);
      local_680 = &local_fa8;
      local_684 = local_1044;
      local_1080 = (void *)((long)local_320 + (long)local_d74 * (long)local_1044 * local_d90);
      local_690 = &local_ff0;
      local_694 = local_1044;
      local_1088 = (void *)((long)local_2e8 + (long)local_d74 * (long)local_1044 * local_d90);
      for (local_108c = 0; local_108c < local_d54; local_108c = local_108c + 1) {
        *local_ff8 = *(undefined4 *)((long)local_1050 + (long)local_108c * 4);
        local_ff8[1] = *(undefined4 *)((long)local_1058 + (long)local_108c * 4);
        local_ff8[2] = *(undefined4 *)((long)local_1060 + (long)local_108c * 4);
        local_ff8[3] = *(undefined4 *)((long)local_1068 + (long)local_108c * 4);
        local_ff8[4] = *(undefined4 *)((long)local_1070 + (long)local_108c * 4);
        local_ff8[5] = *(undefined4 *)((long)local_1078 + (long)local_108c * 4);
        local_ff8[6] = *(undefined4 *)((long)local_1080 + (long)local_108c * 4);
        local_ff8[7] = *(undefined4 *)((long)local_1088 + (long)local_108c * 4);
        local_ff8 = local_ff8 + 8;
      }
    }
    local_d20 = &local_ff0;
    local_d10 = &local_fa8;
    local_d00 = &local_f60;
    local_cf0 = &local_f18;
    local_ce0 = &local_ed0;
    local_cd0 = &local_e88;
    local_cc0 = &local_e40;
    local_e50 = 0;
    local_e54 = 0;
    local_e58 = 0;
    local_e5c = 0;
    local_e70 = 0;
    local_e78 = 0;
    local_e80 = 0;
    local_e88 = 0;
    local_e98 = 0;
    local_e9c = 0;
    local_ea0 = 0;
    local_ea4 = 0;
    local_eb8 = 0;
    local_ec0 = 0;
    local_ec8 = 0;
    local_ed0 = 0;
    local_ee0 = 0;
    local_ee4 = 0;
    local_ee8 = 0;
    local_eec = 0;
    local_f00 = 0;
    local_f08 = 0;
    local_f10 = 0;
    local_f18 = 0;
    local_f28 = 0;
    local_f2c = 0;
    local_f30 = 0;
    local_f34 = 0;
    local_f48 = 0;
    local_f50 = 0;
    local_f58 = 0;
    local_f60 = 0;
    local_f70 = 0;
    local_f74 = 0;
    local_f78 = 0;
    local_f7c = 0;
    local_f90 = 0;
    local_f98 = 0;
    local_fa0 = 0;
    local_fa8 = 0;
    local_fb8 = 0;
    local_fbc = 0;
    local_fc0 = 0;
    local_fc4 = 0;
    local_fd8 = 0;
    local_fe0 = 0;
    local_fe8 = 0;
    local_ff0 = 0;
    local_1008 = 0;
    local_100c = 0;
    local_1010 = 0;
    local_1014 = 0;
    local_1028 = 0;
    local_1030 = 0;
    local_1038 = 0;
    local_1040 = 0;
    local_14 = 0x10;
    local_24 = 0x10;
    local_34 = 0x10;
    local_44 = 0x10;
    local_54 = 0x10;
    local_64 = 0x10;
    local_74 = 0x10;
    local_84 = 0x10;
    local_94 = 0x10;
    local_72c = local_db0;
    local_72d = 1;
    local_75d = 1;
    local_78d = 1;
    local_7bd = 1;
    local_7ed = 1;
    local_81d = 1;
    local_84d = 1;
    local_87d = 1;
    local_8ad = 1;
    local_e48 = 0;
    local_e60 = 0;
    local_e90 = 0;
    local_ea8 = 0;
    local_ed8 = 0;
    local_ef0 = 0;
    local_f20 = 0;
    local_f38 = 0;
    local_f68 = 0;
    local_f80 = 0;
    local_fb0 = 0;
    local_fc8 = 0;
    local_1000 = 0;
    local_1018 = 0;
    local_e40 = 0;
    local_e30 = 0;
    local_e28 = 0;
    local_e18 = 0;
    local_e14 = 0;
    local_e10 = 0;
    local_e0c = 0;
    local_e08 = 0;
    local_e00 = 0;
    local_e38 = 0;
    local_cb0 = &local_df8;
    local_df8 = 0;
    local_de8 = 0;
    local_de0 = 0;
    local_dd0 = 0;
    local_dcc = 0;
    local_dc8 = 0;
    local_dc4 = 0;
    local_dc0 = 0;
    local_db8 = 0;
    local_df0 = 0;
    local_b08 = local_cb0;
    local_ae8 = local_cc0;
    local_ac8 = local_cd0;
    local_aa8 = local_ce0;
    local_a88 = local_cf0;
    local_a68 = local_d00;
    local_a48 = local_d10;
    local_a28 = local_d20;
    local_a08 = local_d30;
    local_1020 = local_2c8;
  }
  for (; local_db0 + 3 < local_d48; local_db0 = local_db0 + 4) {
    local_8d0 = &local_10d8;
    local_8d8 = &local_da0;
    local_278 = (void *)((long)local_da0 + local_d60 * local_db0 * local_d90);
    local_260 = &local_10d8;
    local_a0 = (long)local_d74 * (long)local_d70 * local_d90;
    local_90c = local_db0 + 1;
    local_900 = &local_1120;
    local_908 = &local_da0;
    local_240 = (void *)((long)local_da0 + local_d60 * local_90c * local_d90);
    local_228 = &local_1120;
    local_b0 = (long)local_d74 * (long)local_d70 * local_d90;
    local_93c = local_db0 + 2;
    local_930 = &local_1168;
    local_938 = &local_da0;
    local_208 = (void *)((long)local_da0 + local_d60 * local_93c * local_d90);
    local_1f0 = &local_1168;
    local_c0 = (long)local_d74 * (long)local_d70 * local_d90;
    local_96c = local_db0 + 3;
    local_960 = &local_11b0;
    local_968 = &local_da0;
    local_1d0 = (void *)((long)local_da0 + local_d60 * local_96c * local_d90);
    local_1b8 = &local_11b0;
    local_d0 = (long)local_d74 * (long)local_d70 * local_d90;
    local_99c = local_db0 / 8 +
                (int)((long)((ulong)(uint)((int)((long)local_db0 % 8) >> 0x1f) << 0x20 |
                            (long)local_db0 % 8 & 0xffffffffU) / 4);
    local_990 = &local_1200;
    local_184 = *(int *)((long)local_d40 + 0x2c);
    local_188 = (int)local_d40[6];
    local_18c = *(undefined4 *)((long)local_d40 + 0x34);
    local_198 = (undefined4 *)(*local_d40 + local_d40[8] * (long)local_99c * local_d40[2]);
    local_1a0 = local_d40[2];
    local_1a4 = (undefined4)local_d40[3];
    local_1b0 = local_d40[4];
    local_180 = &local_1200;
    local_e0 = (long)local_184 * (long)local_188 * local_1a0;
    local_6f8 = &local_1200;
    local_ca0 = &local_1200;
    local_11b8 = local_198;
    for (local_1204 = 0; local_1204 < local_d44; local_1204 = local_1204 + 1) {
      local_6a0 = &local_10d8;
      local_6a4 = local_1204;
      local_1210 = (void *)((long)local_278 + (long)local_d74 * (long)local_1204 * local_d90);
      local_6b0 = &local_1120;
      local_6b4 = local_1204;
      local_1218 = (void *)((long)local_240 + (long)local_d74 * (long)local_1204 * local_d90);
      local_6c0 = &local_1168;
      local_6c4 = local_1204;
      local_1220 = (void *)((long)local_208 + (long)local_d74 * (long)local_1204 * local_d90);
      local_6d0 = &local_11b0;
      local_6d4 = local_1204;
      local_1228 = (void *)((long)local_1d0 + (long)local_d74 * (long)local_1204 * local_d90);
      for (local_122c = 0; local_122c < local_d54; local_122c = local_122c + 1) {
        *local_11b8 = *(undefined4 *)((long)local_1210 + (long)local_122c * 4);
        local_11b8[1] = *(undefined4 *)((long)local_1218 + (long)local_122c * 4);
        local_11b8[2] = *(undefined4 *)((long)local_1220 + (long)local_122c * 4);
        local_11b8[3] = *(undefined4 *)((long)local_1228 + (long)local_122c * 4);
        local_11b8 = local_11b8 + 4;
      }
    }
    local_c90 = &local_11b0;
    local_c80 = &local_1168;
    local_c70 = &local_1120;
    local_1130 = 0;
    local_1134 = 0;
    local_1138 = 0;
    local_113c = 0;
    local_1150 = 0;
    local_1158 = 0;
    local_1160 = 0;
    local_1168 = 0;
    local_1178 = 0;
    local_117c = 0;
    local_1180 = 0;
    local_1184 = 0;
    local_1198 = 0;
    local_11a0 = 0;
    local_11a8 = 0;
    local_11b0 = 0;
    local_11c8 = 0;
    local_11cc = 0;
    local_11d0 = 0;
    local_11d4 = 0;
    local_11e8 = 0;
    local_11f0 = 0;
    local_11f8 = 0;
    local_1200 = 0;
    local_a4 = 0x10;
    local_b4 = 0x10;
    local_c4 = 0x10;
    local_d4 = 0x10;
    local_e4 = 0x10;
    local_8dc = local_db0;
    local_8dd = 1;
    local_90d = 1;
    local_93d = 1;
    local_96d = 1;
    local_99d = 1;
    local_1128 = 0;
    local_1140 = 0;
    local_1170 = 0;
    local_1188 = 0;
    local_11c0 = 0;
    local_11d8 = 0;
    local_1120 = 0;
    local_1110 = 0;
    local_1108 = 0;
    local_10f8 = 0;
    local_10f4 = 0;
    local_10f0 = 0;
    local_10ec = 0;
    local_10e8 = 0;
    local_10e0 = 0;
    local_1118 = 0;
    local_c60 = &local_10d8;
    local_10d8 = 0;
    local_10c8 = 0;
    local_10c0 = 0;
    local_10b0 = 0;
    local_10ac = 0;
    local_10a8 = 0;
    local_10a4 = 0;
    local_10a0 = 0;
    local_1098 = 0;
    local_10d0 = 0;
    local_ba8 = local_c60;
    local_b88 = local_c70;
    local_b68 = local_c80;
    local_b48 = local_c90;
    local_b28 = local_ca0;
    local_11e0 = local_1b0;
  }
  for (; local_db0 < local_d48; local_db0 = local_db0 + 1) {
    local_9c0 = &local_1278;
    local_9c8 = &local_da0;
    local_160 = (void *)((long)local_da0 + local_d60 * local_db0 * local_d90);
    local_148 = &local_1278;
    local_f0 = (long)local_d74 * (long)local_d70 * local_d90;
    local_9fc = local_db0 / 8 +
                (int)((long)((ulong)(uint)((int)((long)local_db0 % 8) >> 0x1f) << 0x20 |
                            (long)local_db0 % 8 & 0xffffffffU) / 4) + local_db0 % 4;
    local_9f0 = &local_12c8;
    local_114 = *(int *)((long)local_d40 + 0x2c);
    local_118 = (int)local_d40[6];
    local_11c = *(undefined4 *)((long)local_d40 + 0x34);
    local_128 = (undefined4 *)(*local_d40 + local_d40[8] * (long)local_9fc * local_d40[2]);
    local_130 = local_d40[2];
    local_134 = (undefined4)local_d40[3];
    local_140 = local_d40[4];
    local_110 = &local_12c8;
    local_100 = (long)local_114 * (long)local_118 * local_130;
    local_700 = &local_12c8;
    local_c50 = &local_12c8;
    local_f4 = 0x10;
    local_104 = 0x10;
    local_9cc = local_db0;
    local_9cd = 1;
    local_9fd = 1;
    local_12c8 = 0;
    local_12b8 = 0;
    local_12b0 = 0;
    local_12a0 = 0;
    local_129c = 0;
    local_1298 = 0;
    local_1294 = 0;
    local_1290 = 0;
    local_1288 = 0;
    local_12c0 = 0;
    local_1280 = local_128;
    for (local_12cc = 0; local_12cc < local_d44; local_12cc = local_12cc + 1) {
      local_6e0 = &local_1278;
      local_6e4 = local_12cc;
      for (local_12dc = 0; local_12dc < local_d54; local_12dc = local_12dc + 1) {
        *local_1280 = *(undefined4 *)
                       ((long)local_160 +
                       (long)local_12dc * 4 + (long)local_d74 * (long)local_12cc * local_d90);
        local_1280 = local_1280 + 1;
      }
    }
    local_c40 = &local_1278;
    local_1278 = 0;
    local_1268 = 0;
    local_1260 = 0;
    local_1250 = 0;
    local_124c = 0;
    local_1248 = 0;
    local_1244 = 0;
    local_1240 = 0;
    local_1238 = 0;
    local_1270 = 0;
    local_be8 = local_c40;
    local_bc8 = local_c50;
    local_12a8 = local_140;
  }
  local_c30 = &local_da0;
  if (local_d98 != (int *)0x0) {
    local_c0c = 0xffffffff;
    LOCK();
    local_c10 = *local_d98;
    *local_d98 = *local_d98 + -1;
    UNLOCK();
    if (local_c10 == 1) {
      local_c08 = local_c30;
      if (local_d80 == (long *)0x0) {
        if (local_da0 != (void *)0x0) {
          free(local_da0);
        }
      }
      else {
        (**(code **)(*local_d80 + 0x18))(local_d80,local_da0);
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = 8b-maxk-inch-outch/8b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
#if __SSE2__
    kernel_tm.create(8 * maxk, inch, outch / 8 + (outch % 8) / 4 + outch % 4);

    int q = 0;
    for (; q + 7 < outch; q += 8)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);
        const Mat k4 = kernel.channel(q + 4);
        const Mat k5 = kernel.channel(q + 5);
        const Mat k6 = kernel.channel(q + 6);
        const Mat k7 = kernel.channel(q + 7);

        float* g00 = kernel_tm.channel(q / 8);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);
            const float* k10 = k1.row(p);
            const float* k20 = k2.row(p);
            const float* k30 = k3.row(p);
            const float* k40 = k4.row(p);
            const float* k50 = k5.row(p);
            const float* k60 = k6.row(p);
            const float* k70 = k7.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];
                g00[4] = k40[k];
                g00[5] = k50[k];
                g00[6] = k60[k];
                g00[7] = k70[k];

                g00 += 8;
            }
        }
    }
    for (; q + 3 < outch; q += 4)
    {
        const Mat k0 = kernel.channel(q);
        const Mat k1 = kernel.channel(q + 1);
        const Mat k2 = kernel.channel(q + 2);
        const Mat k3 = kernel.channel(q + 3);

        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);
            const float* k10 = k1.row(p);
            const float* k20 = k2.row(p);
            const float* k30 = k3.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];
                g00[1] = k10[k];
                g00[2] = k20[k];
                g00[3] = k30[k];

                g00 += 4;
            }
        }
    }
    for (; q < outch; q++)
    {
        const Mat k0 = kernel.channel(q);

        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4 + q % 4);

        for (int p = 0; p < inch; p++)
        {
            const float* k00 = k0.row(p);

            for (int k = 0; k < maxk; k++)
            {
                g00[0] = k00[k];

                g00 += 1;
            }
        }
    }
#else
    kernel_tm = kernel;
#endif // __SSE2__
}